

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::ctx_read
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          ptr<buffer> *ctx_buf,uint32_t flags,error_code err,size_t bytes_transferred)

{
  char *pcVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  element_type *this_00;
  size_t sVar5;
  options *poVar6;
  int64_t bytes;
  buffer_serializer *in_RSI;
  long in_RDI;
  uint in_R9D;
  ptr<rpc_exception> except;
  ptr<buffer> actual_ctx;
  uint16_t hint_version;
  size_t hint_len;
  bool meta_ok;
  void *resp_meta_raw;
  size_t resp_meta_len;
  int remaining_len;
  buffer_serializer bs;
  ptr<rpc_exception> except_1;
  ptr<buffer> *in_stack_fffffffffffffe78;
  resp_msg *in_stack_fffffffffffffe80;
  shared_ptr<nuraft::rpc_exception> *__args_1;
  element_type *in_stack_fffffffffffffe88;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe90;
  size_t *in_stack_fffffffffffffe98;
  ptr<buffer> *dst;
  element_type *in_stack_fffffffffffffea0;
  buffer_serializer *in_stack_fffffffffffffeb0;
  undefined1 uVar7;
  asio_rpc_client *in_stack_ffffffffffffff00;
  undefined1 local_f0 [38];
  uint16_t local_ca;
  ulong local_c8;
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91;
  char *local_90;
  string *meta_str;
  string *psVar8;
  undefined4 in_stack_ffffffffffffff80;
  ptr<resp_msg> *in_stack_ffffffffffffff88;
  ptr<req_msg> *in_stack_ffffffffffffff90;
  asio_rpc_client *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffc8;
  
  if (((in_R9D & 1) == 0) && ((in_R9D & 2) == 0)) {
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4085a2);
    uVar7 = (undefined1)((ulong)in_RDI >> 0x38);
    nuraft::buffer::pos((buffer *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4085bb);
    std::shared_ptr<nuraft::buffer>::shared_ptr
              ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    resp_msg::set_ctx(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4085f8);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)in_stack_fffffffffffffea0);
    set_busy_flag(in_stack_ffffffffffffff00,(bool)uVar7);
    std::shared_ptr<nuraft::rpc_exception>::shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x40862d);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffe90,(shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe88,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffe80);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x408656);
  }
  else {
    buffer_serializer::buffer_serializer
              ((buffer_serializer *)in_stack_fffffffffffffe90,
               (ptr<buffer> *)in_stack_fffffffffffffe88,
               (endianness)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    this_00 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4086cb);
    sVar5 = nuraft::buffer::size(this_00);
    iVar4 = (int)sVar5;
    if ((in_R9D & 1) != 0) {
      meta_str = (string *)0x0;
      local_90 = (char *)buffer_serializer::get_bytes
                                   ((buffer_serializer *)in_stack_fffffffffffffea0,
                                    in_stack_fffffffffffffe98);
      asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18));
      bVar2 = std::function::operator_cast_to_bool
                        ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)0x408739);
      if ((bVar2) &&
         ((psVar8 = meta_str, meta_str != (string *)0x0 ||
          (poVar6 = asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18)),
          psVar8 = meta_str, (poVar6->invoke_resp_cb_on_empty_meta_ & 1U) != 0)))) {
        pcVar1 = local_90;
        meta_str = psVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,pcVar1,(ulong)psVar8,&local_b9);
        bVar2 = handle_custom_resp_meta
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88,
                           (rpc_handler *)CONCAT44(iVar4,in_stack_ffffffffffffff80),meta_str);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        in_stack_fffffffffffffeb0 = in_RSI;
        local_91 = bVar2;
        if (!bVar2) {
          return;
        }
      }
      iVar4 = iVar4 - ((int)meta_str + 4);
    }
    uVar7 = (undefined1)((ulong)in_RDI >> 0x38);
    if ((in_R9D & 2) != 0) {
      local_c8 = 0;
      local_ca = buffer_serializer::get_u16(in_stack_fffffffffffffeb0);
      uVar3 = buffer_serializer::get_u16(in_stack_fffffffffffffeb0);
      local_c8 = (ulong)uVar3;
      in_stack_fffffffffffffea0 =
           std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4088fe);
      bytes = buffer_serializer::get_i64(in_stack_fffffffffffffeb0);
      resp_msg::set_next_batch_size_hint_in_bytes(in_stack_fffffffffffffea0,bytes);
      iVar4 = iVar4 - ((int)local_c8 + 4);
    }
    if (iVar4 != 0) {
      dst = (ptr<buffer> *)(local_f0 + 0x10);
      nuraft::buffer::alloc(in_stack_ffffffffffffffc8);
      buffer_serializer::get_buffer((buffer_serializer *)in_stack_fffffffffffffea0,dst);
      in_stack_fffffffffffffe88 =
           std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x408984);
      in_stack_fffffffffffffe90 =
           (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)local_f0;
      std::shared_ptr<nuraft::buffer>::shared_ptr
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      resp_msg::set_ctx(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4089c1);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4089ce);
    }
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)in_stack_fffffffffffffea0);
    set_busy_flag(in_stack_ffffffffffffff00,(bool)uVar7);
    __args_1 = (shared_ptr<nuraft::rpc_exception> *)&stack0xffffffffffffff00;
    std::shared_ptr<nuraft::rpc_exception>::shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x408a4e);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffe90,(shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe88,
               __args_1);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x408a77);
  }
  return;
}

Assistant:

void ctx_read(ptr<req_msg>& req,
                  ptr<resp_msg>& rsp,
                  rpc_handler& when_done,
                  ptr<buffer>& ctx_buf,
                  uint32_t flags,
                  std::error_code err,
                  size_t bytes_transferred)
    {
        if ( !(flags & INCLUDE_META) &&
             !(flags & INCLUDE_HINT) ) {
            // Neither meta nor hint exists,
            // just use the buffer as it is for ctx.
            ctx_buf->pos(0);
            rsp->set_ctx(ctx_buf);

            operation_timer_.cancel();
            set_busy_flag(false);
            ptr<rpc_exception> except;
            when_done(rsp, except);
            return;
        }

        // Otherwise: buffer contains composite data.
        buffer_serializer bs(ctx_buf);
        int remaining_len = ctx_buf->size();

        // 1) Custom meta.
        if (flags & INCLUDE_META) {
            size_t resp_meta_len = 0;
            void* resp_meta_raw = bs.get_bytes(resp_meta_len);

            // If callback is given, verify meta
            // (if meta is empty, invoke callback according to the flag).
            if ( impl_->get_options().read_resp_meta_ &&
                 ( resp_meta_len ||
                   impl_->get_options().invoke_resp_cb_on_empty_meta_ ) ) {

                bool meta_ok = handle_custom_resp_meta
                               ( req, rsp, when_done,
                                 std::string( (const char*)resp_meta_raw,
                                              resp_meta_len) );
                if (!meta_ok) return;
            }
            remaining_len -= sizeof(int32) + resp_meta_len;
        }

        // 2) Hint.
        if (flags & INCLUDE_HINT) {
            size_t hint_len = 0;
            uint16_t hint_version = bs.get_u16();
            (void)hint_version;
            hint_len = bs.get_u16();
            rsp->set_next_batch_size_hint_in_bytes(bs.get_i64());
            remaining_len -= sizeof(uint16_t) * 2 + hint_len;
        }

        // 3) Context.
        assert(remaining_len >= 0);
        if (remaining_len) {
            // It has context, read it.
            ptr<buffer> actual_ctx = buffer::alloc(remaining_len);
            bs.get_buffer(actual_ctx);
            rsp->set_ctx(actual_ctx);
        }

        operation_timer_.cancel();
        set_busy_flag(false);
        ptr<rpc_exception> except;
        when_done(rsp, except);
    }